

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O2

Lazy<void> __thiscall
coro_io::sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>
          (coro_io *this,duration<long,_std::ratio<1L,_1000L>_> d)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x58,(nothrow_t *)&std::nothrow);
  if (puVar1 == (undefined8 *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    *puVar1 = sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>;
    puVar1[1] = sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>;
    puVar1[9] = d.__r;
    puVar1[6] = d.__r;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    *(undefined8 **)this = puVar1;
    *(undefined1 *)(puVar1 + 10) = 0;
  }
  return (LazyBase<void,_false>)(LazyBase<void,_false>)this;
}

Assistant:

inline async_simple::coro::Lazy<void> sleep_for(Duration d) {
  if (auto executor = co_await async_simple::CurrentExecutor();
      executor != nullptr) {
    co_await async_simple::coro::sleep(d);
  }
  else {
    co_return co_await sleep_for(d,
                                 coro_io::g_io_context_pool().get_executor());
  }
}